

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_write(_garray *x,t_symbol *filename)

{
  int iVar1;
  _array *p_Var2;
  _glist *x_00;
  _array *array;
  int local_410;
  int i;
  int elemsize;
  int yonset;
  char buf [1000];
  FILE *fd;
  t_symbol *filename_local;
  _garray *x_local;
  
  p_Var2 = garray_getarray_floatonly(x,&i,&local_410);
  if (p_Var2 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
  }
  else {
    x_00 = glist_getcanvas(x->x_glist);
    canvas_makefilename(x_00,filename->s_name,(char *)&elemsize,1000);
    buf._992_8_ = sys_fopen((char *)&elemsize,"w");
    if ((FILE *)buf._992_8_ == (FILE *)0x0) {
      pd_error((void *)0x0,"%s: can\'t create",&elemsize);
    }
    else {
      for (array._4_4_ = 0; array._4_4_ < p_Var2->a_n; array._4_4_ = array._4_4_ + 1) {
        iVar1 = fprintf((FILE *)buf._992_8_,"%g\n",
                        (double)*(float *)(p_Var2->a_vec + (long)i + (long)array._4_4_ * 8));
        if (iVar1 < 1) {
          post("%s: write error",filename->s_name);
          break;
        }
      }
      fclose((FILE *)buf._992_8_);
    }
  }
  return;
}

Assistant:

static void garray_write(t_garray *x, t_symbol *filename)
{
    FILE *fd;
    char buf[MAXPDSTRING];
    int yonset, elemsize, i;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    canvas_makefilename(glist_getcanvas(x->x_glist), filename->s_name,
        buf, MAXPDSTRING);
    if (!(fd = sys_fopen(buf, "w")))
    {
        pd_error(0, "%s: can't create", buf);
        return;
    }
    for (i = 0; i < array->a_n; i++)
    {
        if (fprintf(fd, "%g\n",
            *(t_float *)(((array->a_vec + sizeof(t_word) * i)) + yonset)) < 1)
        {
            post("%s: write error", filename->s_name);
            break;
        }
    }
    fclose(fd);
}